

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

int __thiscall
QSocks5SocketEngine::bind(QSocks5SocketEngine *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  QSocks5SocketEnginePrivate *this_00;
  QUdpSocket *pQVar2;
  QHostAddressPrivate *pQVar3;
  QTcpSocket *pQVar4;
  Socks5Mode socks5Mode;
  char cVar5;
  bool bVar6;
  quint16 qVar7;
  NetworkLayerProtocol NVar8;
  SocketType SVar9;
  SocketState SVar10;
  SocketError error;
  qsizetype qVar11;
  undefined4 in_register_00000034;
  int iVar12;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QDeadlineTimer local_68;
  QArrayDataPointer<char16_t> local_58;
  QHostAddress address;
  
  qVar7 = (quint16)__addr;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
  address.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&address);
  NVar8 = QHostAddress::protocol((QHostAddress *)CONCAT44(in_register_00000034,__fd));
  if (NVar8 == AnyIPProtocol) {
    QHostAddress::operator=(&address,AnyIPv4);
  }
  else {
    QHostAddress::operator=(&address,(QHostAddress *)CONCAT44(in_register_00000034,__fd));
  }
  if (this_00->data == (QSocks5Data *)0x0) {
    SVar9 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)this);
    if (SVar9 == TcpSocket) {
      socks5Mode = BindMode;
LAB_00220fb6:
      QSocks5SocketEnginePrivate::initialize(this_00,socks5Mode);
      goto LAB_00220fbf;
    }
    SVar9 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)this);
    if (SVar9 == UdpSocket) {
      socks5Mode = UdpAssociateMode;
      goto LAB_00220fb6;
    }
  }
  else {
LAB_00220fbf:
    if (this_00->mode == BindMode) {
      QHostAddress::operator=(&(this_00->super_QAbstractSocketEnginePrivate).localAddress,&address);
LAB_00221053:
      (this_00->super_QAbstractSocketEnginePrivate).localPort = qVar7;
      pQVar4 = this_00->data->controlSocket;
      QNetworkProxy::hostName((QString *)&local_58,&this_00->proxyInfo);
      qVar7 = QNetworkProxy::port(&this_00->proxyInfo);
      (**(code **)(*(long *)&pQVar4->super_QAbstractSocket + 0xf8))(pQVar4,&local_58,qVar7,3,2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1l>>
                (&local_68,(duration<long,_std::ratio<1L,_1L>_>)0x5,CoarseTimer);
      iVar12 = 0;
      bVar6 = QSocks5SocketEnginePrivate::waitForConnected(this_00,local_68,(bool *)0x0);
      if (!bVar6) goto LAB_002211f5;
      SVar10 = QAbstractSocket::state(&this_00->data->controlSocket->super_QAbstractSocket);
      if (SVar10 != UnconnectedState) {
        if (this_00->socks5State == UdpAssociateSuccess) {
          QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,BoundState);
          QHostAddress::operator=
                    (&this_00->udpData->associateAddress,
                     &(this_00->super_QAbstractSocketEnginePrivate).localAddress);
          QHostAddress::QHostAddress((QHostAddress *)&local_58);
          pQVar3 = (this_00->super_QAbstractSocketEnginePrivate).localAddress.d.d.ptr;
          (this_00->super_QAbstractSocketEnginePrivate).localAddress.d.d.ptr =
               (QHostAddressPrivate *)local_58.d;
          local_58.d = (Data *)pQVar3;
          QHostAddress::~QHostAddress((QHostAddress *)&local_58);
          this_00->udpData->associatePort = (this_00->super_QAbstractSocketEnginePrivate).localPort;
          (this_00->super_QAbstractSocketEnginePrivate).localPort = 0;
        }
        else {
          if (this_00->socks5State != BindSuccess) {
            qVar11 = QtPrivate::lengthHelperPointer<char>("Network operation timed out");
            latin1.m_data = "Network operation timed out";
            latin1.m_size = qVar11;
            QString::QString((QString *)&local_58,latin1);
            QAbstractSocketEngine::setError
                      ((QAbstractSocketEngine *)this,SocketTimeoutError,(QString *)&local_58);
            goto LAB_002211ed;
          }
          QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,BoundState);
        }
        iVar12 = 1;
        goto LAB_002211f5;
      }
    }
    else if (this_00->mode == UdpAssociateMode) {
      pQVar2 = this_00->udpData->udpSocket;
      cVar5 = (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0xf0))
                        (pQVar2,&address,(ulong)__addr & 0xffff,0);
      if (cVar5 != '\0') {
        QAbstractSocket::localAddress((QAbstractSocket *)&local_58);
        pQVar3 = (this_00->super_QAbstractSocketEnginePrivate).localAddress.d.d.ptr;
        (this_00->super_QAbstractSocketEnginePrivate).localAddress.d.d.ptr =
             (QHostAddressPrivate *)local_58.d;
        local_58.d = (Data *)pQVar3;
        QHostAddress::~QHostAddress((QHostAddress *)&local_58);
        qVar7 = QAbstractSocket::localPort(&this_00->udpData->udpSocket->super_QAbstractSocket);
        goto LAB_00221053;
      }
      error = QAbstractSocket::error(&this_00->udpData->udpSocket->super_QAbstractSocket);
      QIODevice::errorString();
      QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,error,(QString *)&local_58);
LAB_002211ed:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
  }
  iVar12 = 0;
LAB_002211f5:
  QHostAddress::~QHostAddress(&address);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::bind(const QHostAddress &addr, quint16 port)
{
    Q_D(QSocks5SocketEngine);

    // when bind we will block until the bind is finished as the info from the proxy server is needed

    QHostAddress address;
    if (addr.protocol() == QAbstractSocket::AnyIPProtocol)
        address = QHostAddress::AnyIPv4; //SOCKS5 doesn't support dual stack, and there isn't any implementation of udp on ipv6 yet
    else
        address = addr;

    if (!d->data) {
        if (socketType() == QAbstractSocket::TcpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::BindMode);
#ifndef QT_NO_UDPSOCKET
        } else if (socketType() == QAbstractSocket::UdpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
#endif
        } else {
            //### something invalid
            return false;
        }
    }

#ifndef QT_NO_UDPSOCKET
    if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        if (!d->udpData->udpSocket->bind(address, port)) {
            QSOCKS5_Q_DEBUG << "local udp bind failed";
            setError(d->udpData->udpSocket->error(), d->udpData->udpSocket->errorString());
            return false;
        }
        d->localAddress = d->udpData->udpSocket->localAddress();
        d->localPort = d->udpData->udpSocket->localPort();
    } else
#endif
    if (d->mode == QSocks5SocketEnginePrivate::BindMode) {
        d->localAddress = address;
        d->localPort = port;
    } else {
        //### something invalid
        return false;
    }

    d->data->controlSocket->connectToHost(d->proxyInfo.hostName(), d->proxyInfo.port());
    if (!d->waitForConnected(QDeadlineTimer{Socks5BlockingBindTimeout}, nullptr) ||
        d->data->controlSocket->state() == QAbstractSocket::UnconnectedState) {
        // waitForConnected sets the error state and closes the socket
        QSOCKS5_Q_DEBUG << "waitForConnected to proxy server" << d->data->controlSocket->errorString();
        return false;
    }
    if (d->socks5State == QSocks5SocketEnginePrivate::BindSuccess) {
        setState(QAbstractSocket::BoundState);
        return true;
#ifndef QT_NO_UDPSOCKET
    } else if (d->socks5State == QSocks5SocketEnginePrivate::UdpAssociateSuccess) {
        setState(QAbstractSocket::BoundState);
        d->udpData->associateAddress = d->localAddress;
        d->localAddress = QHostAddress();
        d->udpData->associatePort = d->localPort;
        d->localPort = 0;
        return true;
#endif // QT_NO_UDPSOCKET
    }

    // binding timed out
    setError(QAbstractSocket::SocketTimeoutError,
             QLatin1StringView(QT_TRANSLATE_NOOP("QSocks5SocketEngine", "Network operation timed out")));

///###    delete d->udpSocket;
///###    d->udpSocket = 0;
    return false;
}